

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O2

void __thiscall iqxmlrpc::ValueBuilder::do_visit_text(ValueBuilder *this,string *text)

{
  int iVar1;
  long lVar2;
  Date_time *this_00;
  XML_RPC_violation *this_01;
  double dVar3;
  string local_40;
  
  switch((this->state_).curr_) {
  case 0:
    (this->super_ValueBuilderBase).super_BuilderBase.want_exit_ = true;
  case 1:
    this_00 = (Date_time *)operator_new(0x28);
    Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Scalar
              ((Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this_00,text);
    break;
  case 2:
    this_00 = (Date_time *)operator_new(0x10);
    iVar1 = boost::lexical_cast<int,std::__cxx11::string>(text);
    (this_00->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Value_type_0019ea68;
    *(int *)&((_Alloc_hider *)&(this_00->tm_).tm_sec)->_M_p = iVar1;
    break;
  case 3:
    this_00 = (Date_time *)operator_new(0x10);
    lVar2 = boost::lexical_cast<long,std::__cxx11::string>(text);
    (this_00->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Value_type_0019eab8;
    (this_00->tm_).tm_sec = (int)lVar2;
    (this_00->tm_).tm_min = (int)((ulong)lVar2 >> 0x20);
    break;
  case 4:
    this_00 = (Date_time *)operator_new(0x10);
    iVar1 = boost::lexical_cast<int,std::__cxx11::string>(text);
    (this_00->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Value_type_0019eb08;
    *(bool *)&((_Alloc_hider *)&(this_00->tm_).tm_sec)->_M_p = iVar1 != 0;
    break;
  case 5:
    this_00 = (Date_time *)operator_new(0x10);
    dVar3 = boost::lexical_cast<double,std::__cxx11::string>(text);
    (this_00->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Value_type_0019eb58;
    *(double *)&this_00->tm_ = dVar3;
    break;
  case 6:
    this_00 = (Date_time *)Binary_data::from_base64(text);
    break;
  case 7:
    this_00 = (Date_time *)operator_new(0x60);
    Date_time::Date_time(this_00,text);
    break;
  default:
    this_01 = (XML_RPC_violation *)__cxa_allocate_exception(0x18);
    Parser::context_abi_cxx11_(&local_40,(this->super_ValueBuilderBase).super_BuilderBase.parser_);
    XML_RPC_violation::XML_RPC_violation(this_01,&local_40);
    __cxa_throw(this_01,&XML_RPC_violation::typeinfo,std::runtime_error::~runtime_error);
  }
  std::auto_ptr<iqxmlrpc::Value_type>::reset
            (&(this->super_ValueBuilderBase).retval,&this_00->super_Value_type);
  return;
}

Assistant:

void
ValueBuilder::do_visit_text(const std::string& text)
{
  using boost::lexical_cast;

  switch (state_.get_state()) {
  case VALUE:
    want_exit();
  case STRING:
    retval.reset(new String(text));
    break;

  case INT:
    retval.reset(new Int(lexical_cast<int>(text)));
    break;

  case INT64:
    retval.reset(new Int64(lexical_cast<int64_t>(text)));
    break;

  case BOOL:
    retval.reset(new Bool(lexical_cast<int>(text) != 0));
    break;

  case DOUBLE:
    retval.reset(new Double(lexical_cast<double>(text)));
    break;

  case BINARY:
    retval.reset(Binary_data::from_base64(text));
    break;

  case TIME:
    retval.reset(new Date_time(text));
    break;

  default:
    throw XML_RPC_violation(parser_.context());
  }
}